

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O1

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int *piVar10;
  int ki;
  int iVar11;
  int iVar12;
  void *pvVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  int kj;
  int iVar28;
  ulong uVar29;
  void *pvVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  void *pvVar37;
  int iVar38;
  ulong uVar39;
  int l;
  ulong uVar40;
  bool bVar41;
  float fVar42;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  ulong local_210;
  void *local_208;
  int local_200;
  int local_1fc;
  void *local_1d8;
  ulong local_1d0;
  ulong local_1a8;
  void *local_1a0;
  void *local_188;
  allocator_type local_179;
  ulong local_178;
  long local_170;
  ulong local_168;
  long local_160;
  long local_158;
  ulong local_150;
  Mat local_148;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  long local_e0;
  void *local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_a8;
  long local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  iVar24 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  local_168 = CONCAT44(local_168._4_4_,bottom_blob->d);
  uVar3 = bottom_blob->c;
  uVar25 = (ulong)uVar3;
  sVar6 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_148.cstep = 0;
      local_148.data = (void *)0x0;
      local_148.refcount._0_4_ = 0;
      local_148.refcount._4_4_ = 0;
      local_148.elemsize._0_4_ = 0;
      local_148.elemsize._4_4_ = 0;
      local_148.elempack = 0;
      local_148.allocator = (Allocator *)0x0;
      local_148.dims = 0;
      local_148.w = 0;
      local_148.h = 0;
      local_148.d = 0;
      local_148.c = 0;
      local_78.lightmode = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78.num_threads = opt->num_threads;
      local_78.blob_allocator = opt->blob_allocator;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      uVar27._0_1_ = opt->use_bf16_storage;
      uVar27._1_1_ = opt->use_fp16_packed;
      uVar27._2_1_ = opt->use_fp16_storage;
      uVar27._3_1_ = opt->use_fp16_arithmetic;
      uVar27._4_1_ = opt->use_int8_packed;
      uVar27._5_1_ = opt->use_int8_storage;
      uVar27._6_1_ = opt->use_int8_arithmetic;
      uVar27._7_1_ = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_reserved_0 = opt->use_reserved_0;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_shader_local_memory = opt->use_shader_local_memory;
      local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
      local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
      local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
      local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
      local_78.use_reserved_6 = opt->use_reserved_6;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78._32_8_ = uVar27 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_148,&local_78);
      iVar4 = local_148.d;
      iVar2 = local_148.h;
      iVar24 = local_148.w;
      iVar26 = -100;
      if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
        iVar5 = (local_148.w - this->kernel_w) / this->stride_w;
        uVar27 = (long)(local_148.h - this->kernel_h) / (long)this->stride_h;
        local_f0 = uVar27 & 0xffffffff;
        uVar21 = iVar5 + 1;
        uVar22 = (int)uVar27 + 1;
        uVar29 = (ulong)uVar22;
        uVar27 = (long)(local_148.d - this->kernel_d) / (long)this->stride_d;
        local_178 = uVar27 & 0xffffffff;
        uVar33 = (int)uVar27 + 1;
        local_b8 = (ulong)uVar33;
        Mat::create(top_blob,uVar21,uVar22,uVar33,uVar3,sVar6,(Allocator *)0x0);
        iVar26 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar27 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_90,uVar27,&local_179);
          if (0 < this->kernel_d) {
            iVar26 = this->kernel_w;
            iVar11 = this->kernel_h;
            iVar36 = 0;
            iVar31 = 0;
            iVar28 = 0;
            do {
              if (0 < this->kernel_h) {
                iVar12 = 0;
                do {
                  if (0 < this->kernel_w) {
                    lVar17 = 0;
                    do {
                      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar28 + lVar17] = iVar31 + (int)lVar17;
                      lVar17 = lVar17 + 1;
                      iVar32 = (int)lVar17;
                    } while (iVar32 < this->kernel_w);
                    iVar28 = iVar28 + iVar32;
                    iVar31 = iVar31 + iVar32;
                  }
                  iVar31 = iVar31 + (iVar24 - iVar26);
                  iVar12 = iVar12 + 1;
                } while (iVar12 < this->kernel_h);
              }
              iVar31 = iVar31 + (iVar2 - iVar11) * iVar24;
              iVar36 = iVar36 + 1;
            } while (iVar36 < this->kernel_d);
          }
          iVar26 = (int)uVar27;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              local_1fc = 0;
              iVar26 = 0;
              local_200 = 0;
              if (this->pad_mode == 0) {
                local_1fc = (bottom_blob->w - local_148.w) + this->pad_left + this->pad_right;
                iVar26 = (bottom_blob->h - local_148.h) + this->pad_top + this->pad_bottom;
                local_200 = (bottom_blob->d - local_148.d) + this->pad_front + this->pad_behind;
              }
              if (0 < (int)uVar3) {
                local_e8 = local_148.data;
                local_d8 = top_blob->data;
                local_e0 = top_blob->cstep * top_blob->elemsize;
                local_c8 = (long)this->stride_d;
                local_98 = (long)(int)uVar21;
                local_168 = (ulong)uVar21;
                local_d0 = local_148.cstep *
                           CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                lVar17 = (long)local_148.w *
                         CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                local_c0 = local_148.h * lVar17 * local_c8;
                local_f8 = 0;
                do {
                  if (-1 < (int)local_178) {
                    local_188 = (void *)(local_e0 * local_f8 + (long)local_d8);
                    local_a0 = (long)this->stride_h;
                    local_170 = lVar17 * local_a0;
                    pvVar13 = local_e8;
                    uVar27 = 0;
                    do {
                      local_b0 = uVar27;
                      local_a8 = pvVar13;
                      if (-1 < (int)local_f0) {
                        local_158 = (long)this->stride_w;
                        uVar3 = this->kernel_d;
                        local_160 = local_158 * 4;
                        local_1a8 = 0;
                        local_1a0 = local_a8;
                        do {
                          if (-1 < iVar5) {
                            iVar11 = this->pad_front;
                            lVar35 = 0;
                            uVar27 = 0;
                            pvVar13 = local_1a0;
                            do {
                              fVar42 = NAN;
                              if (0 < (int)uVar3) {
                                lVar19 = (long)((iVar26 + iVar2) - this->pad_bottom);
                                lVar18 = (long)((local_200 + iVar4) - this->pad_behind);
                                fVar42 = 0.0;
                                uVar39 = 0;
                                iVar36 = 0;
                                pvVar37 = pvVar13;
                                do {
                                  lVar14 = local_b0 * local_c8 + uVar39;
                                  iVar31 = 0x5e;
                                  if (iVar11 <= lVar14) {
                                    iVar31 = 0;
                                    if (lVar18 <= lVar14) {
                                      iVar31 = 0x5c;
                                    }
                                    if (lVar14 < lVar18 && 0 < this->kernel_h) {
                                      uVar16 = 0;
                                      pvVar30 = pvVar37;
                                      do {
                                        lVar14 = uVar16 + local_1a8 * local_a0;
                                        iVar28 = 0x61;
                                        if (this->pad_top <= lVar14) {
                                          iVar28 = 0;
                                          if (lVar19 <= lVar14) {
                                            iVar28 = 0x5f;
                                          }
                                          if (lVar14 < lVar19 && 0 < this->kernel_w) {
                                            uVar40 = 0;
                                            do {
                                              iVar31 = 100;
                                              if (((long)this->pad_left <= (long)(lVar35 + uVar40))
                                                 && (iVar31 = 0x62,
                                                    (long)(lVar35 + uVar40) <
                                                    (long)((local_1fc + iVar24) - this->pad_right)))
                                              {
                                                fVar42 = fVar42 + *(float *)((long)pvVar30 +
                                                                            uVar40 * 4);
                                                iVar36 = iVar36 + 1;
                                                iVar31 = 0;
                                              }
                                            } while (((iVar31 == 100) || (iVar28 = 0, iVar31 == 0))
                                                    && (uVar40 = uVar40 + 1, iVar28 = 0,
                                                       (uint)this->kernel_w != uVar40));
                                          }
                                        }
                                        iVar31 = 0;
                                        if ((iVar28 != 0x61) && (iVar28 != 0)) break;
                                        uVar16 = uVar16 + 1;
                                        pvVar30 = (void *)((long)pvVar30 + lVar17);
                                      } while (uVar16 != (uint)this->kernel_h);
                                    }
                                  }
                                  if ((iVar31 != 0x5e) && (iVar31 != 0)) break;
                                  uVar39 = uVar39 + 1;
                                  pvVar37 = (void *)((long)pvVar37 + local_148.h * lVar17);
                                } while (uVar39 != uVar3);
                                fVar42 = fVar42 / (float)iVar36;
                                local_150 = uVar27;
                              }
                              *(float *)((long)local_188 + uVar27 * 4) = fVar42;
                              uVar27 = uVar27 + 1;
                              pvVar13 = (void *)((long)pvVar13 + local_160);
                              lVar35 = lVar35 + local_158;
                            } while (uVar27 != local_168);
                          }
                          local_188 = (void *)((long)local_188 + local_98 * 4);
                          local_1a8 = local_1a8 + 1;
                          local_1a0 = (void *)((long)local_1a0 + local_170);
                        } while (local_1a8 != uVar29);
                      }
                      pvVar13 = (void *)((long)local_a8 + local_c0);
                      uVar27 = local_b0 + 1;
                    } while (local_b0 + 1 != local_b8);
                  }
                  local_f8 = local_f8 + 1;
                  local_e8 = (void *)((long)local_e8 + local_d0);
                } while (local_f8 != uVar25);
              }
            }
            else if (0 < (int)uVar3) {
              sVar6 = top_blob->cstep;
              sVar7 = top_blob->elemsize;
              pvVar13 = top_blob->data;
              lVar17 = (long)local_148.w *
                       CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
              local_210 = 0;
              do {
                if (-1 < (int)local_178) {
                  pvVar37 = (void *)(sVar6 * sVar7 * local_210 + (long)pvVar13);
                  iVar24 = 0;
                  do {
                    if (-1 < (int)local_f0) {
                      iVar2 = this->stride_d;
                      iVar4 = this->stride_h;
                      iVar11 = this->stride_w;
                      uVar39 = 0;
                      do {
                        if (-1 < iVar5) {
                          uVar16 = 0;
                          do {
                            if (iVar26 < 1) {
                              fVar42 = 0.0;
                            }
                            else {
                              fVar42 = 0.0;
                              uVar40 = 0;
                              do {
                                fVar42 = fVar42 + *(float *)((long)local_148.data +
                                                            (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar40] *
                                                  4 + uVar16 * (long)iVar11 * 4 +
                                                      uVar39 * iVar4 * lVar17 +
                                                      (long)iVar24 * (long)iVar2 *
                                                      local_148.h * lVar17 +
                                                      local_148.cstep *
                                                      CONCAT44(local_148.elemsize._4_4_,
                                                               (undefined4)local_148.elemsize) *
                                                      local_210);
                                uVar40 = uVar40 + 1;
                              } while ((uVar27 & 0xffffffff) != uVar40);
                            }
                            *(float *)((long)pvVar37 + uVar16 * 4) = fVar42 * (1.0 / (float)iVar26);
                            uVar16 = uVar16 + 1;
                          } while (uVar16 != uVar21);
                        }
                        pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar21 * 4);
                        uVar39 = uVar39 + 1;
                      } while (uVar39 != uVar29);
                    }
                    bVar41 = iVar24 != (int)local_178;
                    iVar24 = iVar24 + 1;
                  } while (bVar41);
                }
                local_210 = local_210 + 1;
              } while (local_210 != uVar25);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar3)) {
            pvVar13 = top_blob->data;
            sVar6 = top_blob->cstep;
            sVar7 = top_blob->elemsize;
            lVar17 = (long)local_148.w *
                     CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
            local_210 = 0;
            do {
              if (-1 < (int)local_178) {
                pvVar37 = (void *)(sVar6 * sVar7 * local_210 + (long)pvVar13);
                iVar24 = 0;
                do {
                  if (-1 < (int)local_f0) {
                    iVar2 = this->stride_d;
                    iVar4 = this->stride_h;
                    iVar11 = this->stride_w;
                    uVar39 = 0;
                    do {
                      if (-1 < iVar5) {
                        lVar35 = uVar39 * iVar4 * lVar17 +
                                 (long)iVar24 * (long)iVar2 * local_148.h * lVar17 +
                                 local_148.cstep *
                                 CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) *
                                 local_210;
                        uVar16 = 0;
                        do {
                          lVar18 = uVar16 * (long)iVar11;
                          fVar42 = *(float *)((long)local_148.data + lVar18 * 4 + lVar35);
                          if (0 < iVar26) {
                            uVar40 = 0;
                            do {
                              fVar1 = *(float *)((long)local_148.data +
                                                (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar40] *
                                                4 + lVar18 * 4 + lVar35);
                              if (fVar42 <= fVar1) {
                                fVar42 = fVar1;
                              }
                              uVar40 = uVar40 + 1;
                            } while ((uVar27 & 0xffffffff) != uVar40);
                          }
                          *(float *)((long)pvVar37 + uVar16 * 4) = fVar42;
                          uVar16 = uVar16 + 1;
                        } while (uVar16 != uVar21);
                      }
                      pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar21 * 4);
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != uVar29);
                  }
                  bVar41 = iVar24 != (int)local_178;
                  iVar24 = iVar24 + 1;
                } while (bVar41);
              }
              local_210 = local_210 + 1;
            } while (local_210 != uVar25);
          }
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar26 = 0;
        }
      }
      piVar10 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            if (local_148.data != (void *)0x0) {
              free(local_148.data);
            }
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,this->out_h,this->out_d,uVar3,sVar6,opt->blob_allocator);
      iVar26 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar26 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar3) {
            sVar6 = bottom_blob->cstep;
            sVar7 = bottom_blob->elemsize;
            pvVar13 = bottom_blob->data;
            sVar8 = top_blob->cstep;
            sVar9 = top_blob->elemsize;
            pvVar37 = top_blob->data;
            iVar4 = this->out_h;
            iVar5 = this->out_d;
            local_1d0 = 0;
            do {
              if (0 < iVar5) {
                lVar17 = sVar6 * sVar7 * local_1d0;
                local_208 = (void *)(sVar8 * sVar9 * local_1d0 + (long)pvVar37);
                uVar3 = this->out_w;
                iVar26 = 0;
                do {
                  uVar27 = (long)(iVar26 * (int)local_168) / (long)iVar5;
                  iVar26 = iVar26 + 1;
                  uVar33 = (iVar26 * (int)local_168 + iVar5 + -1) / iVar5;
                  if (0 < iVar4) {
                    iVar11 = (int)uVar27;
                    iVar36 = 0;
                    do {
                      uVar29 = (long)(iVar36 * iVar2) / (long)iVar4;
                      iVar36 = iVar36 + 1;
                      uVar21 = (iVar36 * iVar2 + iVar4 + -1) / iVar4;
                      if (0 < (int)uVar3) {
                        iVar31 = (int)uVar29;
                        uVar39 = 0;
                        do {
                          uVar40 = uVar27 & 0xffffffff;
                          iVar28 = (iVar24 * (int)uVar39) / (int)uVar3;
                          uVar16 = uVar39 + 1;
                          iVar12 = (int)((int)uVar16 * iVar24 + (uVar3 - 1)) / (int)uVar3;
                          iVar32 = iVar28 + (iVar11 * iVar2 + iVar31) * iVar24;
                          fVar42 = *(float *)((long)pvVar13 + (long)iVar32 * 4 + lVar17);
                          if (iVar11 < (int)uVar33) {
                            do {
                              uVar23 = uVar29 & 0xffffffff;
                              iVar15 = iVar32;
                              if (iVar31 < (int)uVar21) {
                                do {
                                  lVar35 = (long)iVar12 - (long)iVar28;
                                  iVar34 = iVar15;
                                  if (iVar28 < iVar12) {
                                    do {
                                      fVar1 = *(float *)((long)pvVar13 + (long)iVar34 * 4 + lVar17);
                                      if (fVar42 <= fVar1) {
                                        fVar42 = fVar1;
                                      }
                                      iVar34 = iVar34 + 1;
                                      lVar35 = lVar35 + -1;
                                    } while (lVar35 != 0);
                                  }
                                  uVar22 = (int)uVar23 + 1;
                                  uVar23 = (ulong)uVar22;
                                  iVar15 = iVar15 + iVar24;
                                } while (uVar22 != uVar21);
                              }
                              uVar22 = (int)uVar40 + 1;
                              uVar40 = (ulong)uVar22;
                              iVar32 = iVar32 + iVar2 * iVar24;
                            } while (uVar22 != uVar33);
                          }
                          *(float *)((long)local_208 + uVar39 * 4) = fVar42;
                          uVar39 = uVar16;
                        } while (uVar16 != uVar3);
                      }
                      local_208 = (void *)((long)local_208 + (long)(int)uVar3 * 4);
                    } while (iVar36 != iVar4);
                  }
                } while (iVar26 != iVar5);
              }
              local_1d0 = local_1d0 + 1;
              iVar26 = 0;
            } while (local_1d0 != uVar25);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar3)) {
          sVar6 = bottom_blob->cstep;
          sVar7 = bottom_blob->elemsize;
          pvVar13 = bottom_blob->data;
          sVar8 = top_blob->cstep;
          sVar9 = top_blob->elemsize;
          pvVar37 = top_blob->data;
          iVar4 = this->out_h;
          iVar5 = this->out_d;
          local_1d0 = 0;
          do {
            if (0 < iVar5) {
              local_1d8 = (void *)(sVar8 * sVar9 * local_1d0 + (long)pvVar37);
              uVar3 = this->out_w;
              iVar26 = 0;
              do {
                iVar36 = (iVar26 * (int)local_168) / iVar5;
                iVar26 = iVar26 + 1;
                iVar11 = (iVar26 * (int)local_168 + iVar5 + -1) / iVar5;
                if (0 < iVar4) {
                  iVar31 = 0;
                  do {
                    uVar27 = (long)(iVar31 * iVar2) / (long)iVar4;
                    iVar31 = iVar31 + 1;
                    uVar33 = (iVar31 * iVar2 + iVar4 + -1) / iVar4;
                    if (0 < (int)uVar3) {
                      iVar28 = (int)uVar27;
                      uVar29 = 0;
                      do {
                        iVar32 = (iVar24 * (int)uVar29) / (int)uVar3;
                        uVar39 = uVar29 + 1;
                        iVar12 = (int)((int)uVar39 * iVar24 + (uVar3 - 1)) / (int)uVar3;
                        fVar42 = 0.0;
                        if (iVar36 < iVar11) {
                          iVar34 = (iVar2 * iVar36 + iVar28) * iVar24 + iVar32;
                          iVar15 = iVar36;
                          do {
                            uVar16 = uVar27 & 0xffffffff;
                            iVar20 = iVar34;
                            if (iVar28 < (int)uVar33) {
                              do {
                                lVar17 = (long)iVar12 - (long)iVar32;
                                iVar38 = iVar20;
                                if (iVar32 < iVar12) {
                                  do {
                                    fVar42 = fVar42 + *(float *)((long)pvVar13 +
                                                                (long)iVar38 * 4 +
                                                                sVar6 * sVar7 * local_1d0);
                                    iVar38 = iVar38 + 1;
                                    lVar17 = lVar17 + -1;
                                  } while (lVar17 != 0);
                                }
                                uVar21 = (int)uVar16 + 1;
                                uVar16 = (ulong)uVar21;
                                iVar20 = iVar20 + iVar24;
                              } while (uVar21 != uVar33);
                            }
                            iVar15 = iVar15 + 1;
                            iVar34 = iVar34 + iVar2 * iVar24;
                          } while (iVar15 != iVar11);
                        }
                        *(float *)((long)local_1d8 + uVar29 * 4) =
                             fVar42 / ((float)(iVar12 - iVar32) *
                                      (float)(int)(uVar33 - iVar28) * (float)(iVar11 - iVar36));
                        uVar29 = uVar39;
                      } while (uVar39 != uVar3);
                    }
                    local_1d8 = (void *)((long)local_1d8 + (long)(int)uVar3 * 4);
                  } while (iVar31 != iVar4);
                }
              } while (iVar26 != iVar5);
            }
            local_1d0 = local_1d0 + 1;
            iVar26 = 0;
          } while (local_1d0 != uVar25);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar3,sVar6,opt->blob_allocator);
    iVar26 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar33 = iVar2 * iVar24 * (int)local_168;
      if (this->pooling_type == 0) {
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar13 = bottom_blob->data;
        lVar17 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar37 = top_blob->data;
        uVar27 = 0;
        pvVar30 = pvVar13;
        do {
          fVar42 = *(float *)((long)pvVar13 + lVar17 * uVar27);
          if (0 < (int)uVar33) {
            uVar29 = 0;
            do {
              fVar1 = *(float *)((long)pvVar30 + uVar29 * 4);
              if (fVar42 <= fVar1) {
                fVar42 = fVar1;
              }
              uVar29 = uVar29 + 1;
            } while (uVar33 != uVar29);
          }
          *(float *)((long)pvVar37 + uVar27 * 4) = fVar42;
          uVar27 = uVar27 + 1;
          pvVar30 = (void *)((long)pvVar30 + lVar17);
        } while (uVar27 != uVar25);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar13 = bottom_blob->data;
        sVar6 = bottom_blob->cstep;
        pvVar37 = top_blob->data;
        sVar7 = bottom_blob->elemsize;
        uVar27 = 0;
        do {
          fVar42 = 0.0;
          if (0 < (int)uVar33) {
            uVar29 = 0;
            do {
              fVar42 = fVar42 + *(float *)((long)pvVar13 + uVar29 * 4);
              uVar29 = uVar29 + 1;
            } while (uVar33 != uVar29);
          }
          *(float *)((long)pvVar37 + uVar27 * 4) = fVar42 * (1.0 / (float)(int)uVar33);
          uVar27 = uVar27 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
        } while (uVar27 != uVar25);
      }
      iVar26 = 0;
    }
  }
  return iVar26;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}